

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O0

_Bool fs_stdio_filename_exists(char *path)

{
  int iVar1;
  int *piVar2;
  char *in_RDI;
  _Bool ret;
  WRAP_STAT_TYPE st;
  uint3 in_stack_ffffffffffffff64;
  uint uVar3;
  int errnum;
  stat local_98;
  
  uVar3 = (uint)in_stack_ffffffffffffff64;
  iVar1 = stat(in_RDI,&local_98);
  errnum = CONCAT13(iVar1 == 0,(int3)uVar3);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 2) {
      __errno_location();
      al_set_errno(errnum);
    }
  }
  return (_Bool)((byte)((uint)errnum >> 0x18) & 1);
}

Assistant:

static bool fs_stdio_filename_exists(const char *path)
{
   WRAP_STAT_TYPE st;
   bool ret = false;
   ASSERT(path);

#ifdef ALLEGRO_WINDOWS
   {
      /* Pass an path created by _wfullpath() to avoid issues
       * with stat() failing when there is a trailing slash.
       */
      wchar_t *abs_path = make_absolute_path(path);
      if (abs_path) {
         ret = (0 == WRAP_STAT(abs_path, &st));
         if (!ret && errno != ENOENT) {
            al_set_errno(errno);
         }
         free(abs_path);
      }
   }
#else
   ret = (0 == WRAP_STAT(path, &st));
   if (!ret && errno != ENOENT) {
      al_set_errno(errno);
   }
#endif

   return ret;
}